

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O2

UINT32 WriteCompressionTable(UINT32 dataSize,UINT8 *data,PCM_COMPR_TBL *comprTbl)

{
  UINT8 UVar1;
  uint uVar2;
  UINT8 *__src;
  uint uVar3;
  
  uVar2 = (uint)comprTbl->valueCount * (comprTbl->bitsDec + 7 >> 3);
  uVar3 = uVar2 + 6;
  if (dataSize < uVar3) {
    uVar3 = 0xffffffff;
  }
  else {
    *data = comprTbl->comprType;
    UVar1 = data[1];
    comprTbl->cmpSubType = UVar1;
    data[1] = UVar1;
    UVar1 = data[2];
    comprTbl->bitsDec = UVar1;
    data[2] = UVar1;
    UVar1 = data[3];
    comprTbl->bitsCmp = UVar1;
    data[3] = UVar1;
    *(UINT16 *)(data + 4) = comprTbl->valueCount;
    __src = (UINT8 *)realloc((comprTbl->values).d8,(ulong)uVar2);
    (comprTbl->values).d8 = __src;
    memcpy(data + 6,__src,(ulong)uVar2);
  }
  return uVar3;
}

Assistant:

UINT32 WriteCompressionTable(UINT32 dataSize, UINT8* data, PCM_COMPR_TBL* comprTbl)
{
	UINT8 valSize;
	UINT32 tblSize;
	
	valSize = (comprTbl->bitsDec + 7) / 8;
	tblSize = comprTbl->valueCount * valSize;
	
	if (dataSize < 0x06 + tblSize)
	{
		//printf("Warning! Bad PCM Table Length!\n");
		return (UINT32)-1;
	}
	
	data[0x00] = comprTbl->comprType;
	data[0x01] = comprTbl->cmpSubType = data[0x01];
	data[0x02] = comprTbl->bitsDec = data[0x02];
	data[0x03] = comprTbl->bitsCmp = data[0x03];
	WriteLE16(&data[0x04], comprTbl->valueCount);
	
	comprTbl->values.d8 = (UINT8*)realloc(comprTbl->values.d8, tblSize);
	if (valSize < 0x02)
	{
		memcpy(&data[0x06], comprTbl->values.d8, tblSize);
	}
	else
	{
#ifndef VGM_LITTLE_ENDIAN
		UINT16 curVal;
		
		for (curVal = 0x00; curVal < comprTbl->valueCount; curVal ++)
			WriteLE16(&data[0x06 + curVal * 0x02], comprTbl->values.d16[curVal]);
#else
		memcpy(&data[0x06], comprTbl->values.d16, tblSize);
#endif
	}
	
	return 0x06 + tblSize;
}